

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::
Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
::insert(Table<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashIndex<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Callbacks>_>
         *this,Entry *row)

{
  long lVar1;
  undefined8 *puVar2;
  Entry *pEVar3;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry,_kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_>
                       *)this,(*(long *)(this + 8) - *(long *)this >> 3) * -0x3333333333333333,row,
             0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    lVar1 = *(long *)(this + 0x10);
    if (*(long *)(this + 8) == lVar1) {
      newSize = 4;
      if (lVar1 != *(long *)this) {
        newSize = (lVar1 - *(long *)this >> 3) * -0x6666666666666666;
      }
      Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
      setCapacity((Vector<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                   *)this,newSize);
    }
    puVar2 = *(undefined8 **)(this + 8);
    *puVar2 = (row->key).super_StringPtr.content.ptr;
    puVar2[1] = (row->key).super_StringPtr.content.size_;
    puVar2[2] = *(undefined8 *)&row->value;
    puVar2[3] = row[1].key.super_StringPtr.content.ptr;
    puVar2[4] = row[1].key.super_StringPtr.content.size_;
    (row->key).super_StringPtr.content.size_ = 0;
    *(undefined8 *)&row->value = 0;
    row[1].key.super_StringPtr.content.ptr = (char *)0x0;
    pEVar3 = *(Entry **)(this + 8);
    *(uint **)(this + 8) = &pEVar3[1].value;
    return pEVar3;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}